

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O3

size_t get_FMfieldLong_by_name(FMFieldList field_list,char *fieldname,void *data)

{
  int iVar1;
  size_t sVar2;
  char *__s1;
  FMFieldList p_Var3;
  FMgetFieldStruct descr;
  _FMgetFieldStruct local_30;
  
  __s1 = field_list->field_name;
  if (__s1 != (char *)0x0) {
    p_Var3 = field_list + 1;
    do {
      iVar1 = strcmp(__s1,fieldname);
      if (iVar1 == 0) {
        local_30.offset = (size_t)p_Var3[-1].field_offset;
        local_30.size = p_Var3[-1].field_size;
        local_30.data_type = integer_type;
        local_30.byte_swap = '\0';
        local_30.src_float_format = '\x01';
        local_30.target_float_format = '\x01';
        sVar2 = get_big_int(&local_30,data);
        return sVar2;
      }
      __s1 = p_Var3->field_name;
      p_Var3 = p_Var3 + 1;
    } while (__s1 != (char *)0x0);
  }
  printf("Field %s not found\n",fieldname);
  return 0;
}

Assistant:

extern size_t
get_FMfieldLong_by_name(FMFieldList field_list, const char *fieldname, void *data)
{
    int index;
    FMgetFieldStruct descr;

    for (index = 0; field_list[index].field_name != NULL; index++) {
	if (strcmp(field_list[index].field_name, fieldname) == 0) {
	    break;
	}
    }
    if (field_list[index].field_name == NULL) {
	printf("Field %s not found\n", fieldname);
	return 0;
    }

    descr.offset = field_list[index].field_offset;
    descr.size = field_list[index].field_size;
    descr.data_type = integer_type;
    descr.byte_swap = 0;
    descr.src_float_format = descr.target_float_format = Format_IEEE_754_bigendian;
    return get_FMlong(&descr, data);
}